

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O0

void nn_fsm_event_process(nn_fsm_event *self)

{
  int src_00;
  int type_00;
  void *srcptr_00;
  void *srcptr;
  int type;
  int src;
  nn_fsm_event *self_local;
  
  src_00 = self->src;
  type_00 = self->type;
  srcptr_00 = self->srcptr;
  self->src = -1;
  self->type = -1;
  self->srcptr = (void *)0x0;
  nn_fsm_feed(self->fsm,src_00,type_00,srcptr_00);
  return;
}

Assistant:

void nn_fsm_event_process (struct nn_fsm_event *self)
{
    int src;
    int type;
    void *srcptr;

    src = self->src;
    type = self->type;
    srcptr = self->srcptr;
    self->src = -1;
    self->type = -1;
    self->srcptr = NULL;

    nn_fsm_feed (self->fsm, src, type, srcptr);
}